

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O2

void __thiscall wirehair::Codec::CopyDeferredRows(Codec *this)

{
  ushort uVar1;
  ulong uVar2;
  uint uVar3;
  uint16_t *puVar4;
  uint64_t *__dest;
  uint16_t ge_row_i;
  uint uVar5;
  
  uVar5 = (uint)this->_dense_count;
  uVar2 = (ulong)this->_ge_pitch;
  puVar4 = &this->_defer_head_rows;
  __dest = this->_ge_matrix + uVar5 * this->_ge_pitch;
  while( true ) {
    uVar1 = *puVar4;
    if (uVar1 == 0xffff) break;
    memcpy(__dest,this->_compress_matrix + (uint)uVar1 * (int)uVar2,uVar2 << 3);
    uVar3 = uVar5 & 0xffff;
    uVar5 = uVar5 + 1;
    this->_ge_row_map[uVar3] = uVar1;
    puVar4 = &this->_peel_rows[uVar1].NextRow;
    uVar2 = (ulong)this->_ge_pitch;
    __dest = __dest + uVar2;
  }
  return;
}

Assistant:

void Codec::CopyDeferredRows()
{
    CAT_IF_DUMP(cout << endl << "---- CopyDeferredRows ----" << endl << endl;)

    // Get GE matrix row starting at dense rows
    uint64_t * GF256_RESTRICT ge_row = _ge_matrix + _ge_pitch * _dense_count;

    // For each deferred row:
    for (uint16_t ge_row_i = _dense_count, defer_row_i = _defer_head_rows;
        defer_row_i != LIST_TERM;
        ++ge_row_i, ge_row += _ge_pitch)
    {
        CAT_IF_DUMP(cout << "Peeled row " << defer_row_i << " for GE row " << ge_row_i << endl;)

        // Get Compress matrix row
        uint64_t * GF256_RESTRICT compress_row = _compress_matrix + _ge_pitch * defer_row_i;

        // Copy Compress row to GE row
        memcpy(ge_row, compress_row, _ge_pitch * sizeof(uint64_t));

        // Set row map for this deferred row
        _ge_row_map[ge_row_i] = defer_row_i;

        // Get next deferred row from peeling solver output
        defer_row_i = _peel_rows[defer_row_i].NextRow;
    }
}